

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall cmExportFileGenerator::cmExportFileGenerator(cmExportFileGenerator *this)

{
  cmExportFileGenerator *this_local;
  
  this->_vptr_cmExportFileGenerator = (_func_int **)&PTR__cmExportFileGenerator_011c6a00;
  std::__cxx11::string::string((string *)&this->Namespace);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Configurations);
  std::__cxx11::string::string((string *)&this->MainImportFile);
  std::__cxx11::string::string((string *)&this->FileDir);
  std::__cxx11::string::string((string *)&this->FileBase);
  std::__cxx11::string::string((string *)&this->FileExt);
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  set(&this->ExportedTargets);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->MissingTargets);
  this->AppendMode = false;
  this->ExportOld = false;
  return;
}

Assistant:

cmExportFileGenerator::cmExportFileGenerator()
{
  this->AppendMode = false;
  this->ExportOld = false;
}